

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Execute<duckdb::hugeint_t,int,duckdb::ArgMinMaxState<duckdb::hugeint_t,int>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<duckdb::hugeint_t,_int> *state,hugeint_t x_data,int y_data,
          AggregateBinaryInput *binary)

{
  undefined4 in_register_00000084;
  long lVar1;
  ArgMinMaxBase<duckdb::GreaterThan,false> AVar2;
  
  lVar1 = CONCAT44(in_register_00000084,y_data);
  if ((**(long **)(lVar1 + 0x10) != 0) &&
     ((*(ulong *)(**(long **)(lVar1 + 0x10) + (*(ulong *)(lVar1 + 0x20) >> 6) * 8) >>
       (*(ulong *)(lVar1 + 0x20) & 0x3f) & 1) == 0)) {
    return;
  }
  if ((int)x_data.upper <= *(int *)(this + 0x18)) {
    return;
  }
  if (**(long **)(lVar1 + 8) == 0) {
    this[1] = (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0;
  }
  else {
    AVar2 = (ArgMinMaxBase<duckdb::GreaterThan,false>)
            ((*(ulong *)(**(long **)(lVar1 + 8) + (*(ulong *)(lVar1 + 0x18) >> 6) * 8) >>
              (*(ulong *)(lVar1 + 0x18) & 0x3f) & 1) == 0);
    this[1] = AVar2;
    if ((bool)AVar2) goto LAB_0049e6d5;
  }
  *(ArgMinMaxState<duckdb::hugeint_t,_int> **)(this + 8) = state;
  *(uint64_t *)(this + 0x10) = x_data.lower;
LAB_0049e6d5:
  *(int *)(this + 0x18) = (int)x_data.upper;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}